

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcsloop.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool use_cusum;
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  NaPNEvent NVar9;
  char *pcVar10;
  size_t sVar11;
  undefined8 uVar12;
  char *pcVar13;
  undefined8 *puVar14;
  long *plVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  NaVector vInitial;
  NaParams par;
  NaStateSpaceModel au_ssmplant;
  NaStateSpaceModel au_ssmcontr;
  NaNNUnit au_nnp;
  NaControlSystemModel csm;
  NaCombinedFunc au_linplant;
  NaCombinedFunc noise_tf;
  NaCombinedFunc refer_tf;
  NaNNUnit au_nnc;
  NaCombinedFunc au_lincontr;
  NaControllerKind local_6744;
  double local_6740;
  int local_672c;
  NaVector local_66e0 [24];
  NaParams local_66c8 [1056];
  NaStateSpaceModel local_62a8 [224];
  NaStateSpaceModel local_61c8 [224];
  NaNNUnit local_60e8 [152];
  uint local_6050;
  uint local_604c;
  NaControlSystemModel local_5af8;
  NaCombinedFunc local_19e0 [1264];
  NaCombinedFunc local_14f0 [1264];
  NaCombinedFunc local_1000 [1264];
  NaNNUnit local_b10 [152];
  uint local_a78;
  NaCombinedFunc local_520 [1264];
  
  if (argc < 2) {
    main_cold_1();
    return 1;
  }
  NaParams::NaParams(local_66c8,argv[1],argc + -2,argv + 2,"#=");
  NaPrintLog("Run dcsloop with %s\n",argv[1]);
  NaParams::ListOfParamsToLog();
  pcVar10 = (char *)NaParams::GetParam((char *)local_66c8);
  iVar2 = strcmp("lin",pcVar10);
  if (iVar2 == 0) {
    pcVar10 = "Using linear controller in control system loop\n";
  }
  else {
    pcVar10 = (char *)NaParams::GetParam((char *)local_66c8);
    iVar3 = strcmp("nnc",pcVar10);
    if (iVar3 != 0) {
      NaPrintLog("Bad or undefined contr_kind value in .par file\n");
      goto LAB_00106c7d;
    }
    pcVar10 = "Using neural net controller in control system loop\n";
  }
  NaPrintLog(pcVar10);
  pcVar10 = (char *)NaParams::GetParam((char *)local_66c8);
  iVar3 = strcmp("stream",pcVar10);
  if (iVar3 == 0) {
    pcVar10 = "Using stream reference and noise (transfer functions)\n";
  }
  else {
    pcVar10 = (char *)NaParams::GetParam((char *)local_66c8);
    iVar4 = strcmp("file",pcVar10);
    if (iVar4 != 0) {
      NaPrintLog("Bad or undefined input_kind value in .par file\n");
      goto LAB_00106c7d;
    }
    pcVar10 = "Using limited reference and noise series (data files)\n";
  }
  NaPrintLog(pcVar10);
  NaCombinedFunc::NaCombinedFunc(local_1000);
  NaCombinedFunc::NaCombinedFunc(local_14f0);
  NaCombinedFunc::NaCombinedFunc(local_19e0);
  NaCombinedFunc::NaCombinedFunc(local_520);
  NaStateSpaceModel::NaStateSpaceModel(local_61c8);
  NaStateSpaceModel::NaStateSpaceModel(local_62a8);
  NaNNUnit::NaNNUnit(local_b10);
  NaNNUnit::NaNNUnit(local_60e8);
  pcVar10 = (char *)NaParams::GetParam((char *)local_66c8);
  sVar11 = strlen(pcVar10);
  iVar4 = strcmp(pcVar10 + (sVar11 - 4),".ssm");
  if (iVar4 == 0) {
    NaStateSpaceModel::Load((char *)local_62a8);
  }
  else {
    NaCombinedFunc::Load((char *)local_19e0);
  }
  NaVector::NaVector(local_66e0,1);
  if (iVar2 == 0) {
    pcVar10 = (char *)NaParams::GetParam((char *)local_66c8);
    sVar11 = strlen(pcVar10);
    iVar5 = strcmp(pcVar10 + (sVar11 - 4),".ssm");
    if (iVar5 == 0) {
      NaStateSpaceModel::Load((char *)local_61c8);
    }
    else {
      NaCombinedFunc::Load((char *)local_520);
    }
    NaVector::init_zero();
    cVar1 = NaParams::CheckParam((char *)local_66c8);
    if ((cVar1 != '\0') || (cVar1 = NaParams::CheckParam((char *)local_66c8), cVar1 != '\0')) {
      pcVar10 = (char *)NaParams::GetParam((char *)local_66c8);
      dVar19 = atof(pcVar10);
      NaVector::init_value(dVar19);
    }
    local_6744 = NaLinearContr;
  }
  else {
    NaParams::GetParam((char *)local_66c8);
    NaNNUnit::Load((char *)local_b10);
    pcVar10 = (char *)NaParams::GetParam((char *)local_66c8);
    iVar5 = strcmp(pcVar10,"e+r+se");
    local_6744 = NaNeuralContrERSumE;
    if ((iVar5 != 0) && (iVar5 = strcmp(pcVar10,"r+e+se"), iVar5 != 0)) {
      iVar5 = strcmp(pcVar10,"e+r");
      local_6744 = NaNeuralContrER;
      if ((iVar5 != 0) && (iVar5 = strcmp(pcVar10,"r+e"), iVar5 != 0)) {
        iVar5 = strcmp(pcVar10,"e+de");
        if (iVar5 == 0) {
          local_6744 = NaNeuralContrEdE;
        }
        else {
          iVar5 = strcmp(pcVar10,"e+e+...");
          local_6744 = NaNeuralContrER - (iVar5 == 0 || 1 < local_a78);
        }
      }
    }
  }
  local_672c = 0;
  if (iVar3 == 0) {
    NaParams::GetParam((char *)local_66c8);
    NaCombinedFunc::Load((char *)local_1000);
    NaParams::GetParam((char *)local_66c8);
    NaCombinedFunc::Load((char *)local_14f0);
    pcVar10 = (char *)NaParams::GetParam((char *)local_66c8);
    local_672c = atoi(pcVar10);
  }
  use_cusum = (bool)NaParams::CheckParam((char *)local_66c8);
  pcVar10 = (char *)NaParams::GetParam((char *)local_66c8);
  uVar6 = atoi(pcVar10);
  pcVar10 = (char *)NaParams::GetParam((char *)local_66c8);
  uVar8 = 1;
  if (use_cusum != false) {
    uVar8 = uVar6;
  }
  uVar16 = uVar8;
  if ((int)uVar6 < 1) {
    uVar16 = 1;
  }
  if (use_cusum == false) {
    uVar16 = uVar8;
  }
  dVar19 = atof(pcVar10);
  if (0 < (int)uVar16) {
    local_6740 = 0.0;
    dVar23 = 0.0;
    if (0.0 <= dVar19) {
      dVar23 = dVar19;
    }
    pcVar10 = "OFF";
    if (use_cusum != false) {
      pcVar10 = "ON";
    }
    uVar17 = 1;
    do {
      NaPrintLog("Run %d (of %d)\n",uVar17,(ulong)uVar16);
      NaControlSystemModel::NaControlSystemModel(&local_5af8,local_672c,local_6744);
      if (iVar4 == 0) {
        NaPrintLog("plant SS model\n");
        NaControlSystemModel::set_plant_ss_model(&local_5af8,local_62a8);
        cVar1 = NaParams::CheckParam((char *)local_66c8);
        if (cVar1 == '\0') {
          NaPrintLog(
                    "Warning: \'out_x\' parameter is not defined, \'out_x_default.dat\' file is used"
                    );
          NaPNFileOutput::set_output_filename((char *)&local_5af8.plant_x);
        }
        else {
          NaParams::GetParam((char *)local_66c8);
          NaPNFileOutput::set_output_filename((char *)&local_5af8.plant_x);
        }
      }
      else {
        NaPrintLog("plant TF or COF function\n");
        NaControlSystemModel::set_plant_function(&local_5af8,local_19e0);
      }
      cVar1 = NaParams::CheckParam((char *)local_66c8);
      if (cVar1 == '\0') {
        NaPNFileOutput::set_output_filename((char *)&local_5af8.cerr_fout);
      }
      else {
        uVar12 = NaParams::GetParam((char *)local_66c8);
        NaPrintLog("Writing control error statistics to \'%s\' file.\n",uVar12);
        NaParams::GetParam((char *)local_66c8);
        NaPNFileOutput::set_output_filename((char *)&local_5af8.cerr_fout);
        cVar1 = NaParams::CheckParam((char *)local_66c8);
        if (cVar1 != '\0') {
          pcVar13 = (char *)NaParams::GetParam((char *)local_66c8);
          NaPNStatistics::configure_output((char *)&local_5af8.statan_cerr,pcVar13);
        }
        cVar1 = NaParams::CheckParam((char *)local_66c8);
        if (cVar1 != '\0') {
          pcVar13 = (char *)NaParams::GetParam((char *)local_66c8);
          atoi(pcVar13);
          NaPNStatistics::set_floating_gap((int)&local_5af8 + 0x14b8);
        }
      }
      cVar1 = NaParams::CheckParam((char *)local_66c8);
      if ((((cVar1 == '\0') || (cVar1 = NaParams::CheckParam((char *)local_66c8), cVar1 == '\0')) ||
          (cVar1 = NaParams::CheckParam((char *)local_66c8), cVar1 == '\0')) ||
         (cVar1 = NaParams::CheckParam((char *)local_66c8), cVar1 == '\0')) {
        NaControlSystemModel::set_tdg_flag(&local_5af8,false);
      }
      else {
        NaControlSystemModel::set_tdg_flag(&local_5af8,true);
        pcVar13 = (char *)NaParams::GetParam((char *)local_66c8);
        iVar5 = atoi(pcVar13);
        pcVar13 = (char *)NaParams::GetParam((char *)local_66c8);
        atoi(pcVar13);
        pcVar13 = (char *)NaParams::GetParam((char *)local_66c8);
        dVar19 = atof(pcVar13);
        pcVar13 = (char *)NaParams::GetParam((char *)local_66c8);
        dVar20 = atof(pcVar13);
        NaPNTrainDataGath::set_parameters((int)&local_5af8 + 0x3630,iVar5,dVar19,dVar20);
        cVar1 = NaParams::CheckParam((char *)local_66c8);
        if (cVar1 == '\0') {
          NaPNFileOutput::set_output_filename((char *)&local_5af8.tdg_u);
        }
        else {
          NaParams::GetParam((char *)local_66c8);
          NaPNFileOutput::set_output_filename((char *)&local_5af8.tdg_u);
        }
        cVar1 = NaParams::CheckParam((char *)local_66c8);
        if (cVar1 == '\0') {
          NaPNFileOutput::set_output_filename((char *)&local_5af8.tdg_ny);
        }
        else {
          NaParams::GetParam((char *)local_66c8);
          NaPNFileOutput::set_output_filename((char *)&local_5af8.tdg_ny);
        }
      }
      putenv("DRAND_SAFE=1");
      reset_rand();
      NaControlSystemModel::set_cusum_flag(&local_5af8,use_cusum);
      NaPrintLog("Cummulative sum detection is %s starting at %g\n",dVar23,pcVar10);
      if (use_cusum != false) {
        NaPNWatcher::attach_function
                  ((_func_bool_void_ptr_NaVector_ptr_NaTimer_ptr *)&local_5af8.dodetect,
                   OnDisorderDetection);
        cVar1 = NaParams::CheckParam((char *)local_66c8);
        if (cVar1 != '\0') {
          pcVar13 = (char *)NaParams::GetParam((char *)local_66c8);
          atof(pcVar13);
          NaPrintLog("Average time of alarm delay is %g\n");
          pcVar13 = (char *)NaParams::GetParam((char *)local_66c8);
          dVar19 = atof(pcVar13);
          NaPNCuSum::set_smart_detection(dVar19);
        }
      }
      cVar1 = NaParams::CheckParam((char *)local_66c8);
      if (cVar1 != '\0') {
        NaParams::GetParam((char *)local_66c8);
        NaNNUnit::Load((char *)local_60e8);
        NaPNNNUnit::set_nn_unit((NaNNUnit *)&local_5af8.nnplant);
        NaPNTeacher::set_nn((NaPNNNUnit *)&local_5af8.nnpback,(int)&local_5af8 + 0x2528);
        cVar1 = NaParams::CheckParam((char *)local_66c8);
        if (cVar1 == '\0') {
          NaPNFileOutput::set_output_filename((char *)&local_5af8.iderr_fout);
        }
        else {
          uVar12 = NaParams::GetParam((char *)local_66c8);
          NaPrintLog("Writing identification error statistics to \'%s\' file.\n",uVar12);
          NaParams::GetParam((char *)local_66c8);
          NaPNFileOutput::set_output_filename((char *)&local_5af8.iderr_fout);
          cVar1 = NaParams::CheckParam((char *)local_66c8);
          if (cVar1 != '\0') {
            pcVar13 = (char *)NaParams::GetParam((char *)local_66c8);
            NaPNStatistics::configure_output((char *)&local_5af8.statan_iderr,pcVar13);
          }
          cVar1 = NaParams::CheckParam((char *)local_66c8);
          if (cVar1 != '\0') {
            pcVar13 = (char *)NaParams::GetParam((char *)local_66c8);
            atoi(pcVar13);
            NaPNStatistics::set_floating_gap((int)&local_5af8 + 0x2c90);
          }
        }
        NaNeuralNetDescr::InputDelays();
        NaNeuralNetDescr::OutputDelays();
        NaPNDelay::set_delay((int)&local_5af8 + 0x30d0,(uint *)(ulong)local_6050);
        NaPNDelay::set_delay((int)&local_5af8 + 0x2f00,(uint *)(ulong)local_604c);
        uVar6 = NaPNDelay::get_max_delay();
        uVar7 = NaPNDelay::get_max_delay();
        uVar18 = (ulong)((uVar7 - uVar6) + 1);
        uVar8 = 0;
        if (uVar7 < uVar6) {
          uVar18 = 0;
          uVar8 = ~uVar7 + uVar6;
        }
        NaPNSkip::set_skip_number((int)&local_5af8 + 0x2808);
        NaPNSkip::set_skip_number((int)&local_5af8 + 0x2670);
        NaPNFill::set_fill_number((int)&local_5af8 + 0x3480);
        NaPNSkip::set_skip_number((int)&local_5af8 + 0x3cc0);
        NaPrintLog("delay_u=%d,  skip_u=%d\n",(ulong)uVar6,uVar18);
        NaPrintLog("delay_y=%d,  skip_y=%d\n",(ulong)uVar7,(ulong)uVar8);
        NaPrintLog("delay_r=%d,  skip_r=%d\n",(ulong)(uVar8 + uVar7),(ulong)(uVar8 + uVar7 + 1));
        cVar1 = NaParams::CheckParam((char *)local_66c8);
        if (cVar1 == '\0') {
          NaPNFileOutput::set_output_filename((char *)&local_5af8.nn_y);
        }
        else {
          NaParams::GetParam((char *)local_66c8);
          NaPNFileOutput::set_output_filename((char *)&local_5af8.nn_y);
          uVar12 = NaParams::GetParam((char *)local_66c8);
          NaPrintLog("Writing NNP identification output to \'%s\' file.\n",uVar12);
        }
        cVar1 = NaParams::CheckParam((char *)local_66c8);
        if (cVar1 == '\0') {
          NaPNFileOutput::set_output_filename((char *)&local_5af8.nn_e);
        }
        else {
          NaParams::GetParam((char *)local_66c8);
          NaPNFileOutput::set_output_filename((char *)&local_5af8.nn_e);
          uVar12 = NaParams::GetParam((char *)local_66c8);
          NaPrintLog("Writing NNP identification error to \'%s\' file.\n",uVar12);
        }
        cVar1 = NaParams::CheckParam((char *)local_66c8);
        if (cVar1 == '\0') {
          NaPNFileOutput::set_output_filename((char *)&local_5af8.nnp_bpe);
        }
        else {
          NaParams::GetParam((char *)local_66c8);
          NaPNFileOutput::set_output_filename((char *)&local_5af8.nnp_bpe);
          uVar12 = NaParams::GetParam((char *)local_66c8);
          NaPrintLog("Writing NNP backpropagated error to \'%s\' file.\n",uVar12);
        }
      }
      NaControlSystemModel::link_net(&local_5af8);
      NaParams::GetParam((char *)local_66c8);
      NaPNFileOutput::set_output_filename((char *)&local_5af8.chkpnt_r);
      NaParams::GetParam((char *)local_66c8);
      NaPNFileOutput::set_output_filename((char *)&local_5af8.chkpnt_e);
      NaParams::GetParam((char *)local_66c8);
      NaPNFileOutput::set_output_filename((char *)&local_5af8.chkpnt_u);
      NaParams::GetParam((char *)local_66c8);
      NaPNFileOutput::set_output_filename((char *)&local_5af8.chkpnt_n);
      NaParams::GetParam((char *)local_66c8);
      NaPNFileOutput::set_output_filename((char *)&local_5af8.chkpnt_y);
      NaParams::GetParam((char *)local_66c8);
      NaPNFileOutput::set_output_filename((char *)&local_5af8.chkpnt_ny);
      if (local_6744 == NaNeuralContrERSumE) {
        cVar1 = NaParams::CheckParam((char *)local_66c8);
        uVar8 = 0;
        if (cVar1 != '\0') {
          pcVar13 = (char *)NaParams::GetParam((char *)local_66c8);
          uVar8 = atoi(pcVar13);
        }
        NaPrintLog("Depth of error accumulation is %u\n",(ulong)uVar8);
        NaPNAccumulator::set_accum_depth((int)&local_5af8 + 0x1c90);
      }
      if (use_cusum != false) {
        NaParams::GetParam((char *)local_66c8);
        NaPNFileOutput::set_output_filename((char *)&local_5af8.cusum_out);
      }
      if (iVar3 == 0) {
        NaPNRandomGen::set_generator_func((NaUnit *)&local_5af8.setpnt_gen);
        NaPNRandomGen::set_gauss_distrib(0.0,1.0);
        NaPNRandomGen::set_generator_func((NaUnit *)&local_5af8.noise_gen);
        NaPNRandomGen::set_gauss_distrib(0.0,1.0);
      }
      else {
        NaParams::GetParam((char *)local_66c8);
        NaPNFileInput::set_input_filename((char *)&local_5af8.setpnt_inp);
        NaParams::GetParam((char *)local_66c8);
        NaPNFileInput::set_input_filename((char *)&local_5af8.noise_inp);
      }
      NaControlSystemModel::set_initial_cerror(&local_5af8,local_66e0);
      if (iVar2 == 0) {
        NaPNTransfer::set_transfer_func((NaUnit *)&local_5af8.controller);
      }
      else {
        NaPNTransfer::set_transfer_func((NaUnit *)&local_5af8.controller);
        cVar1 = NaParams::CheckParam((char *)local_66c8);
        if (cVar1 == '\0') {
          NaPNFileOutput::set_output_filename((char *)&local_5af8.nn_x);
        }
        else {
          NaParams::GetParam((char *)local_66c8);
          NaPNFileOutput::set_output_filename((char *)&local_5af8.nn_x);
        }
      }
      if (use_cusum != false) {
        pcVar13 = (char *)NaParams::GetParam((char *)local_66c8);
        dVar19 = atof(pcVar13);
        pcVar13 = (char *)NaParams::GetParam((char *)local_66c8);
        dVar20 = atof(pcVar13);
        pcVar13 = (char *)NaParams::GetParam((char *)local_66c8);
        dVar21 = atof(pcVar13);
        pcVar13 = (char *)NaParams::GetParam((char *)local_66c8);
        dVar22 = atof(pcVar13);
        NaPNCuSum::setup(dVar19,dVar20,dVar21,dVar22);
        NaPNCuSum::turn_on_at(dVar23);
        cVar1 = NaParams::CheckParam((char *)local_66c8);
        if (cVar1 != '\0') {
          pcVar13 = (char *)NaParams::GetParam((char *)local_66c8);
          iDetectInterval = atoi(pcVar13);
        }
      }
      NVar9 = NaControlSystemModel::run_net(&local_5af8);
      puVar14 = (undefined8 *)NaVector::operator[]((int)&local_5af8 + 0x15e0);
      printf("\nMean squared error=%g\n",*puVar14);
      NaPrintLog("IMPORTANT: net is dead due to ");
      pcVar13 = "unknown reason.\n";
      if (NVar9 - pneDead < 4) {
        pcVar13 = &DAT_0010a780 + *(int *)(&DAT_0010a780 + (ulong)(NVar9 - pneDead) * 4);
      }
      NaPrintLog(pcVar13);
      if (use_cusum != false) {
        printf("Number of disorder detections %d\n",(ulong)(uint)nDisorderCounter);
        NaPrintLog("Number of disorder detections %d\n",(ulong)(uint)nDisorderCounter);
        if (iDetectInterval < 0) {
          plVar15 = (long *)NaPetriNet::timer();
          dVar19 = (double)(**(code **)(*plVar15 + 0x20))(plVar15);
          printf("Average time of false alarm %g\n",dVar19 / (double)nDisorderCounter);
          plVar15 = (long *)NaPetriNet::timer();
          dVar19 = (double)(**(code **)(*plVar15 + 0x20))(plVar15);
          NaPrintLog("Average time of false alarm %g\n",dVar19 / (double)nDisorderCounter);
        }
        else if (iDetectInterval == 0) {
          plVar15 = (long *)NaPetriNet::timer();
          dVar19 = (double)(**(code **)(*plVar15 + 0x20))(plVar15);
          plVar15 = (long *)NaPetriNet::timer();
          (**(code **)(*plVar15 + 0x20))(plVar15);
          NaPrintLog("Time of alarm delay is %g\n");
          local_6740 = local_6740 + (dVar19 - dVar23);
        }
      }
      NaPNStatistics::print_stat
                ((char *)&local_5af8.statan_r,(_IO_FILE *)"Statistics of set point:");
      NaPNStatistics::print_stat((char *)&local_5af8.statan_cerr,(_IO_FILE *)"Statistics of error:")
      ;
      plVar15 = (long *)NaPetriNet::timer();
      (**(code **)(*plVar15 + 0x10))(plVar15);
      NaControlSystemModel::~NaControlSystemModel(&local_5af8);
      uVar8 = (uint)uVar17;
      uVar17 = (ulong)(uVar8 + 1);
    } while (uVar8 != uVar16);
    if ((uVar16 != 1) && (iDetectInterval == 0)) {
      printf("Average time of alarm delay %g\n");
      NaPrintLog("Average time of alarm delay %g\n",local_6740 / (double)(int)uVar16);
    }
  }
  NaVector::~NaVector(local_66e0);
  NaNNUnit::~NaNNUnit(local_60e8);
  NaNNUnit::~NaNNUnit(local_b10);
  NaStateSpaceModel::~NaStateSpaceModel(local_62a8);
  NaStateSpaceModel::~NaStateSpaceModel(local_61c8);
  NaCombinedFunc::~NaCombinedFunc(local_520);
  NaCombinedFunc::~NaCombinedFunc(local_19e0);
  NaCombinedFunc::~NaCombinedFunc(local_14f0);
  NaCombinedFunc::~NaCombinedFunc(local_1000);
LAB_00106c7d:
  NaParams::~NaParams(local_66c8);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
  if(argc < 2)
    {
      fprintf(stderr, "Usage: dcsloop ParamFile [Extra name=value pairs]\n");
      return 1;
    }

  try{
    NaParams	par(argv[1], argc - 2, argv + 2);

    NaPrintLog("Run dcsloop with %s\n", argv[1]);

    par.ListOfParamsToLog();

    /*************************************************************/
    enum {
      linear_contr,
      neural_contr
    }	contr_kind;

    if(!strcmp("lin", par("contr_kind")))
      {
	NaPrintLog("Using linear controller in control system loop\n");
	contr_kind = linear_contr;
      }
    else if(!strcmp("nnc", par("contr_kind")))
      {
	NaPrintLog("Using neural net controller in control system loop\n");
	contr_kind = neural_contr;
      }
    else
      {
	NaPrintLog("Bad or undefined contr_kind value in .par file\n");
	return 0;
      }

    /*************************************************************/
    enum {
      stream_mode,
      file_mode
    }	inp_data_mode;

    if(!strcmp("stream", par("input_kind")))
      {
	NaPrintLog("Using stream reference and noise (transfer functions)\n");
	inp_data_mode = stream_mode;
      }
    else if(!strcmp("file", par("input_kind")))
      {
	NaPrintLog("Using limited reference and noise series (data files)\n");
	inp_data_mode = file_mode;
      }
    else
      {
	NaPrintLog("Bad or undefined input_kind value in .par file\n");
	return 0;
      }


    /*************************************************************/
    // Applied units
    NaCombinedFunc	refer_tf;
    NaCombinedFunc	noise_tf;
    NaCombinedFunc	au_linplant;
    NaCombinedFunc	au_lincontr;
    NaStateSpaceModel	au_ssmcontr;
    NaStateSpaceModel	au_ssmplant;
    enum { TForCOF, SSModel } ePlantType, eContrType;
    NaNNUnit		au_nnc, au_nnp;


    // Load plant
    const char *szFileName = par("linplant_tf");
    if(!strcmp(szFileName + strlen(szFileName) - 4, ".ssm")) {
      au_ssmplant.Load(szFileName);
      ePlantType = SSModel;
    } else {
      // Otherwise let's try combined/transfer function
      au_linplant.Load(szFileName);
      ePlantType = TForCOF;
    }

    // Initial value of control error comparator
    NaVector	vInitial(1);

    // Type of controller
    NaControllerKind	ckind;

    // Load controller
    switch(contr_kind)
      {
      case linear_contr:
        {
	    // Load plant
	    const char *szFileName = par("lincontr_tf");
	    if(!strcmp(szFileName + strlen(szFileName) - 4, ".ssm")) {
		au_ssmcontr.Load(szFileName);
		eContrType = SSModel;
	    } else {
		// Otherwise let's try combined/transfer function
		au_lincontr.Load(szFileName);
		eContrType = TForCOF;
	    }

	    vInitial.init_zero();
	    if(par.CheckParam("cerror_initial_value"))
		vInitial.init_value(atof(par("cerror_initial_value")));
	    else if(par.CheckParam("plant_initial_state"))
		// old and wrong name for cerror_initial_value semantics
		vInitial.init_value(atof(par("plant_initial_state")));
	    ckind = NaLinearContr;
	}
	break;

      case neural_contr:
	au_nnc.Load(par("nncontr"));

	// Interpret NN-C structure

	// Default rule
	if(au_nnc.descr.nInputsRepeat > 1)
	  ckind = NaNeuralContrDelayedE;
	else
	  ckind = NaNeuralContrER;

	// Explicit rule
	{
	    const char *nnc_mode = par("nnc_mode");
	    if(!strcmp(nnc_mode, "e+r+se") ||
	       !strcmp(nnc_mode, "r+e+se"))
		ckind = NaNeuralContrERSumE;
	    else if(!strcmp(nnc_mode, "e+r") ||
		    !strcmp(nnc_mode, "r+e"))
		ckind = NaNeuralContrER;
	    else if(!strcmp(nnc_mode, "e+de"))
		ckind = NaNeuralContrEdE;
	    else if(!strcmp(nnc_mode, "e+e+..."))
		ckind = NaNeuralContrDelayedE;
	}
	break;
      }

    // Load input data
    int	len;
    switch(inp_data_mode)
      {
      case stream_mode:
	refer_tf.Load(par("refer_tf"));
	noise_tf.Load(par("noise_tf"));
	len = atoi(par("stream_len"));
	break;
      case file_mode:
	len = 0;
	break;
      }

    bool	bUseCuSum = par.CheckParam("cusum");
    int		nRuns = atoi(par("cusum_atad"));
    NaReal	fStartTime = atof(par("cusum_start_time"));
    if(fStartTime < 0.0)
      fStartTime= 0.0;
    if(bUseCuSum && nRuns <= 0 || !bUseCuSum)
      nRuns = 1;
    NaReal	fTotalTime = 0.0;
       
    for(int iRun = 0; iRun < nRuns; ++iRun)
      {
	NaPrintLog("Run %d (of %d)\n", 1+iRun, nRuns);
	NaControlSystemModel	csm(len, ckind);

	// Plant
	switch(ePlantType)
	  {
	  case TForCOF:
	    NaPrintLog("plant TF or COF function\n");
	    csm.set_plant_function(au_linplant);
	    break;

	  case SSModel:
	    NaPrintLog("plant SS model\n");
	    csm.set_plant_ss_model(au_ssmplant);
	    if(par.CheckParam("out_x"))
	      csm.plant_x.set_output_filename(par("out_x"));
	    else {
		NaPrintLog("Warning: 'out_x' parameter is not defined, 'out_x_default.dat' file is used");
		csm.plant_x.set_output_filename("out_x_default.dat");
	    }
	    break;
	  }

	if(par.CheckParam("cerr_trace_file")) {
	    NaPrintLog("Writing control error statistics to '%s' file.\n",
		       par("cerr_trace_file"));
	    csm.cerr_fout.set_output_filename(par("cerr_trace_file"));
	    if(par.CheckParam("cerr_trace_contents")) {
		csm.statan_cerr.configure_output(par("cerr_trace_contents"));
	    }
	    if(par.CheckParam("cerr_avg_base")) {
		csm.statan_cerr.set_floating_gap(atoi(par("cerr_avg_base")));
	    }
	} else {
	    csm.cerr_fout.set_output_filename(DEV_NULL);
	}

	if(par.CheckParam("tdg_stpardet_len") &&
	   par.CheckParam("tdg_cells") &&
	   par.CheckParam("tdg_sigma_num") &&
	   par.CheckParam("tdg_cover_percent"))
	  {
	    csm.set_tdg_flag(true);
	    csm.trdgath.set_parameters(atoi(par("tdg_stpardet_len")),
				       atoi(par("tdg_cells")),
				       atof(par("tdg_sigma_num")),
				       atof(par("tdg_cover_percent")));

	    if(par.CheckParam("tdg_u"))
	      csm.tdg_u.set_output_filename(par("tdg_u"));
	    else
	      csm.tdg_u.set_output_filename(DEV_NULL);
	    if(par.CheckParam("tdg_ny"))
	      csm.tdg_ny.set_output_filename(par("tdg_ny"));
	    else
	      csm.tdg_ny.set_output_filename(DEV_NULL);
	  }
	else
	  csm.set_tdg_flag(false);

	// Reset pseudo-random sequence
	putenv("DRAND_SAFE=1");
	reset_rand();

	// Set cummulative sum method is turned on or off
	csm.set_cusum_flag(bUseCuSum);
	NaPrintLog("Cummulative sum detection is %s starting at %g\n",
		   bUseCuSum? "ON": "OFF", fStartTime);
	if(bUseCuSum)
	  {
	    csm.dodetect.attach_function(OnDisorderDetection);
	    if(par.CheckParam("atad"))
	      {
		NaPrintLog("Average time of alarm delay is %g\n",
			   atof(par("atad")));
		csm.cusum.set_smart_detection(atof(par("atad")));
	      }
	  }

	// Setup parameters for NN-P
	if(par.CheckParam("in_nnp_file"))
	  {
	    //au_nnp.SetInstance("Plant");
	    au_nnp.Load(par("in_nnp_file"));
	    csm.nnplant.set_nn_unit(&au_nnp);
	    csm.nnpback.set_nn(&csm.nnplant);

	    if(par.CheckParam("iderr_trace_file")) {
		NaPrintLog("Writing identification error statistics to '%s' file.\n",
			   par("iderr_trace_file"));
		csm.iderr_fout.set_output_filename(par("iderr_trace_file"));
		if(par.CheckParam("iderr_trace_contents")) {
		    csm.statan_iderr
			.configure_output(par("iderr_trace_contents"));
		}
		if(par.CheckParam("iderr_avg_base")) {
		    csm.statan_iderr
			.set_floating_gap(atoi(par("iderr_avg_base")));
		}
	    } else {
		csm.iderr_fout.set_output_filename(DEV_NULL);
	    }

	    // Get NNP delays
	    unsigned	*input_delays = au_nnp.descr.InputDelays();
	    unsigned	*output_delays = au_nnp.descr.OutputDelays();

	    // Configure nodes
	    csm.delay_u.set_delay(au_nnp.descr.nInputsRepeat, input_delays);
	    csm.delay_y.set_delay(au_nnp.descr.nOutputsRepeat, output_delays);

	    unsigned	iDelay_u = csm.delay_u.get_max_delay();
	    unsigned	iDelay_y = csm.delay_y.get_max_delay();
	    unsigned	iSkip_u = 0, iSkip_y = 0;
	    unsigned	iDelay_e, iSkip_e;

	    // Skip u or y due to absent earlier values of y or u
	    if(iDelay_y >= iDelay_u)
	      {
		iSkip_u = iDelay_y - iDelay_u + 1;
	      }
	    else /* if(iDelay_u > iDelay_y) */
	      {
		iSkip_y = iDelay_u - iDelay_y - 1;
	      }
	    iDelay_e = iDelay_y + iSkip_y;
	    iSkip_e = 1 + iDelay_e;

	    csm.skip_u.set_skip_number(iSkip_u);
	    csm.skip_y.set_skip_number(iSkip_y);
	    csm.fill_nn_y.set_fill_number(iSkip_e);

	    // Additional delay for target value
	    csm.skip_r.set_skip_number(1 + iSkip_e);

	    NaPrintLog("delay_u=%d,  skip_u=%d\n", iDelay_u, iSkip_u);
	    NaPrintLog("delay_y=%d,  skip_y=%d\n", iDelay_y, iSkip_y);
	    NaPrintLog("delay_r=%d,  skip_r=%d\n", iDelay_e, iSkip_e);

	    if(par.CheckParam("out_nn_y")) {
		csm.nn_y.set_output_filename(par("out_nn_y"));
		NaPrintLog("Writing NNP identification output to '%s' file.\n",
			   par("out_nn_y"));
	    } else {
		csm.nn_y.set_output_filename(DEV_NULL);
	    }

	    if(par.CheckParam("out_nn_e")) {
		csm.nn_e.set_output_filename(par("out_nn_e"));
		NaPrintLog("Writing NNP identification error to '%s' file.\n",
			   par("out_nn_e"));
	    } else {
		csm.nn_e.set_output_filename(DEV_NULL);
	    }

	    if(par.CheckParam("out_nnp_bpe")) {
		csm.nnp_bpe.set_output_filename(par("out_nnp_bpe"));
		NaPrintLog("Writing NNP backpropagated error to '%s' file.\n",
			   par("out_nnp_bpe"));
	    } else {
		csm.nnp_bpe.set_output_filename(DEV_NULL);
	    }
	  }

	// Link the network
	csm.link_net();

	// Configure nodes
	csm.chkpnt_r.set_output_filename(par("out_r"));
	csm.chkpnt_e.set_output_filename(par("out_e"));
	csm.chkpnt_u.set_output_filename(par("out_u"));
	csm.chkpnt_n.set_output_filename(par("out_n"));
	csm.chkpnt_y.set_output_filename(par("out_y"));
	csm.chkpnt_ny.set_output_filename(par("out_ny"));

	if(NaNeuralContrERSumE == ckind) {
	    int nErrAccDepth = 0; // pure integration
	    if(par.CheckParam("err_acc_depth"))
		nErrAccDepth = atoi(par("err_acc_depth"));
	    NaPrintLog("Depth of error accumulation is %u\n", nErrAccDepth);
	    csm.err_acc.set_accum_depth(nErrAccDepth);
	}

	if(bUseCuSum)
	  csm.cusum_out.set_output_filename(par("cusum"));
      
	// Setpoint and noise
	NaReal	fMean = 0.0, fStdDev = 1.0;

	switch(inp_data_mode)
	  {
	  case stream_mode:
	    csm.setpnt_gen.set_generator_func(&refer_tf);
	    csm.setpnt_gen.set_gauss_distrib(fMean, fStdDev);

	    csm.noise_gen.set_generator_func(&noise_tf);
	    csm.noise_gen.set_gauss_distrib(fMean, fStdDev);
	    break;
	  case file_mode:
	    csm.setpnt_inp.set_input_filename(par("in_r"));
	    csm.noise_inp.set_input_filename(par("in_n"));
	    break;
	  }

	csm.set_initial_cerror(vInitial);

	// Controller
	switch(contr_kind)
	  {
	  case linear_contr:
	    if(SSModel == eContrType)
		csm.controller.set_transfer_func(&au_ssmcontr);
	    else
		csm.controller.set_transfer_func(&au_lincontr);
	    break;

	  case neural_contr:
	    csm.controller.set_transfer_func(&au_nnc);

	    if(par.CheckParam("nn_x"))
		csm.nn_x.set_output_filename(par("nn_x"));
	    else
		csm.nn_x.set_output_filename(DEV_NULL);
	    break;
	  }

	// Setup parameters for CUSUM (disorder detection)
	if(bUseCuSum)
	  {
	    csm.cusum.setup(atof(par("sigma0")), atof(par("sigma1")),
			    atof(par("h_sol")), atof(par("k_const")));
	    csm.cusum.turn_on_at(fStartTime);

	    if(par.CheckParam("detect_interval"))
	      iDetectInterval = atoi(par("detect_interval"));
	  }

	NaPNEvent   pnev = csm.run_net();

	printf("\nMean squared error=%g\n", csm.statan_cerr.RMS[0]);

	NaPrintLog("IMPORTANT: net is dead due to ");
	switch(pnev){
	case pneTerminate:
	  NaPrintLog("user break.\n");
	  break;

	case pneHalted:
	  NaPrintLog("internal halt.\n");
	  break;

	case pneDead:
	  NaPrintLog("data are exhausted.\n");
	  break;

	case pneError:
	  NaPrintLog("some error occured.\n");
	  break;

	default:
	  NaPrintLog("unknown reason.\n");
	  break;
	}

	if(bUseCuSum)
	  {
	    printf("Number of disorder detections %d\n", nDisorderCounter);
	    NaPrintLog("Number of disorder detections %d\n", nDisorderCounter);

	    if(iDetectInterval < 0)
	      {
		printf("Average time of false alarm %g\n",
		       csm.net.timer().CurrentTime()/nDisorderCounter);
		NaPrintLog("Average time of false alarm %g\n",
			   csm.net.timer().CurrentTime()/nDisorderCounter);
	      }
	    else if(iDetectInterval == 0)
	      {
		fTotalTime += csm.net.timer().CurrentTime() - fStartTime;
		NaPrintLog("Time of alarm delay is %g\n",
			   csm.net.timer().CurrentTime());
	      }
	  }
     
#if 0
	// Maximum absolute value of an set point
	NaReal  aMax_u;
	if(fabs(csm.statan_u.Min[0]) > fabs(csm.statan_u.Max[0])){
	  aMax = csm.statan_u.Min[0];
	}else{
	  aMax = csm.statan_u.Max[0];
	}
#endif

	csm.statan_r.print_stat("Statistics of set point:");
	csm.statan_cerr.print_stat("Statistics of error:");

	csm.net.timer().ResetTime();

      }/* End of numerous runs */

    if(nRuns > 1 && iDetectInterval == 0)
      {
	printf("Average time of alarm delay %g\n", fTotalTime / nRuns);
	NaPrintLog("Average time of alarm delay %g\n", fTotalTime / nRuns);
      }
  }
  catch(NaException& ex){
    NaPrintLog("EXCEPTION: %s\n", NaExceptionMsg(ex));
    fprintf(stderr, "EXCEPTION: %s\n", NaExceptionMsg(ex));
  }

  return 0;
}